

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_seckey_negate(secp256k1_context *ctx,uchar *seckey)

{
  long in_RSI;
  int ret;
  secp256k1_scalar sec;
  secp256k1_scalar *in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  secp256k1_scalar *in_stack_ffffffffffffffc8;
  secp256k1_scalar *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)(ulong)in_stack_ffffffffffffffc0,
               (char *)in_stack_ffffffffffffffb8);
    local_4 = 0;
  }
  else {
    local_4 = secp256k1_scalar_set_b32_seckey
                        ((secp256k1_scalar *)(ulong)in_stack_ffffffffffffffc0,
                         (uchar *)in_stack_ffffffffffffffb8);
    secp256k1_scalar_cmov
              ((secp256k1_scalar *)&stack0xffffffffffffffc8,&secp256k1_scalar_zero,
               (uint)((local_4 != 0 ^ 0xffU) & 1));
    secp256k1_scalar_negate(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    secp256k1_scalar_get_b32
              ((uchar *)CONCAT44(local_4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8);
    secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffffc8);
  }
  return local_4;
}

Assistant:

int secp256k1_ec_seckey_negate(const secp256k1_context* ctx, unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_negate(&sec, &sec);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    return ret;
}